

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  TestParsingMergeLite_RepeatedFieldsGenerator **v1;
  TestParsingMergeLite_RepeatedFieldsGenerator **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar3;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *this;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *other;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *other_00;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestParsingMergeLite_RepeatedFieldsGenerator *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestParsingMergeLite_RepeatedFieldsGenerator *from;
  TestParsingMergeLite_RepeatedFieldsGenerator *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestParsingMergeLite_RepeatedFieldsGenerator *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestParsingMergeLite_RepeatedFieldsGenerator *)to_msg;
  _this = (TestParsingMergeLite_RepeatedFieldsGenerator *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_const*,proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x1ef4,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  pRVar2 = _internal_mutable_field1(from);
  pRVar3 = _internal_field1((TestParsingMergeLite_RepeatedFieldsGenerator *)
                            absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_field2(from);
  pRVar3 = _internal_field2((TestParsingMergeLite_RepeatedFieldsGenerator *)
                            absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_field3(from);
  pRVar3 = _internal_field3((TestParsingMergeLite_RepeatedFieldsGenerator *)
                            absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(pRVar2,pRVar3);
  this = _internal_mutable_group1(from);
  other = _internal_group1((TestParsingMergeLite_RepeatedFieldsGenerator *)
                           absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::MergeFrom
            (this,other);
  this_00 = _internal_mutable_group2(from);
  other_00 = _internal_group2((TestParsingMergeLite_RepeatedFieldsGenerator *)
                              absl_log_internal_check_op_result);
  google::protobuf::
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::MergeFrom
            (this_00,other_00);
  pRVar2 = _internal_mutable_ext1(from);
  pRVar3 = _internal_ext1((TestParsingMergeLite_RepeatedFieldsGenerator *)
                          absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(pRVar2,pRVar3);
  pRVar2 = _internal_mutable_ext2(from);
  pRVar3 = _internal_ext2((TestParsingMergeLite_RepeatedFieldsGenerator *)
                          absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(pRVar2,pRVar3);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite_RepeatedFieldsGenerator&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field1()->MergeFrom(
      from._internal_field1());
  _this->_internal_mutable_field2()->MergeFrom(
      from._internal_field2());
  _this->_internal_mutable_field3()->MergeFrom(
      from._internal_field3());
  _this->_internal_mutable_group1()->MergeFrom(
      from._internal_group1());
  _this->_internal_mutable_group2()->MergeFrom(
      from._internal_group2());
  _this->_internal_mutable_ext1()->MergeFrom(
      from._internal_ext1());
  _this->_internal_mutable_ext2()->MergeFrom(
      from._internal_ext2());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}